

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

char * SQCompilation::terminatorOpToName(TreeOp op)

{
  TreeOp op_local;
  char *local_8;
  
  switch(op) {
  case TO_RETURN:
    local_8 = "return";
    break;
  default:
    local_8 = "<unkown terminator>";
    break;
  case TO_THROW:
    local_8 = "throw";
    break;
  case TO_BREAK:
    local_8 = "break";
    break;
  case TO_CONTINUE:
    local_8 = "continue";
  }
  return local_8;
}

Assistant:

static const char *terminatorOpToName(enum TreeOp op) {
  switch (op)
  {
  case TO_BREAK: return "break";
  case TO_CONTINUE: return "continue";
  case TO_RETURN: return "return";
  case TO_THROW: return "throw";
  default:
    assert(0);
    return "<unkown terminator>";
  }
}